

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripemd160.c
# Opt level: O0

int mbedtls_internal_ripemd160_process(mbedtls_ripemd160_context *ctx,uchar *data)

{
  uint32_t uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint32_t X [16];
  uint32_t Ep;
  uint32_t Dp;
  uint32_t Cp;
  uint32_t Bp;
  uint32_t Ap;
  uint32_t E;
  uint32_t D;
  uint32_t C;
  uint32_t B;
  uint32_t A;
  uchar *data_local;
  mbedtls_ripemd160_context *ctx_local;
  
  iVar2 = *(int *)data;
  iVar3 = *(int *)(data + 4);
  iVar4 = *(int *)(data + 8);
  iVar5 = *(int *)(data + 0xc);
  iVar6 = *(int *)(data + 0x10);
  iVar7 = *(int *)(data + 0x14);
  iVar8 = *(int *)(data + 0x18);
  iVar9 = *(int *)(data + 0x1c);
  iVar10 = *(int *)(data + 0x20);
  iVar11 = *(int *)(data + 0x24);
  iVar12 = *(int *)(data + 0x28);
  iVar13 = *(int *)(data + 0x2c);
  iVar14 = *(int *)(data + 0x30);
  iVar15 = *(int *)(data + 0x34);
  iVar16 = *(int *)(data + 0x38);
  iVar17 = *(int *)(data + 0x3c);
  uVar26 = ctx->state[1];
  uVar22 = ctx->state[2];
  uVar28 = ctx->state[3];
  uVar1 = ctx->state[4];
  uVar18 = (uVar26 ^ uVar22 ^ uVar28) + iVar2 + ctx->state[0];
  uVar18 = (uVar18 * 0x800 | uVar18 >> 0x15) + uVar1;
  uVar19 = uVar22 << 10 | uVar22 >> 0x16;
  uVar20 = (uVar26 ^ (uVar22 | uVar28 ^ 0xffffffff)) + iVar7 + 0x50a28be6 + ctx->state[0];
  uVar20 = (uVar20 * 0x100 | uVar20 >> 0x18) + uVar1;
  uVar21 = uVar22 << 10 | uVar22 >> 0x16;
  uVar22 = (uVar18 ^ uVar26 ^ uVar19) + iVar3 + uVar1;
  uVar22 = (uVar22 * 0x4000 | uVar22 >> 0x12) + uVar28;
  uVar23 = uVar26 << 10 | uVar26 >> 0x16;
  uVar24 = (uVar20 ^ (uVar26 | uVar21 ^ 0xffffffff)) + iVar16 + 0x50a28be6 + uVar1;
  uVar24 = (uVar24 * 0x200 | uVar24 >> 0x17) + uVar28;
  uVar25 = uVar26 << 10 | uVar26 >> 0x16;
  uVar26 = (uVar22 ^ uVar18 ^ uVar23) + iVar4 + uVar28;
  uVar26 = (uVar26 * 0x8000 | uVar26 >> 0x11) + uVar19;
  uVar27 = uVar18 * 0x400 | uVar18 >> 0x16;
  uVar28 = (uVar24 ^ (uVar20 | uVar25 ^ 0xffffffff)) + iVar9 + 0x50a28be6 + uVar28;
  uVar28 = (uVar28 * 0x200 | uVar28 >> 0x17) + uVar21;
  uVar29 = uVar20 * 0x400 | uVar20 >> 0x16;
  uVar19 = (uVar26 ^ uVar22 ^ uVar27) + iVar5 + uVar19;
  uVar18 = (uVar19 * 0x1000 | uVar19 >> 0x14) + uVar23;
  uVar19 = uVar22 * 0x400 | uVar22 >> 0x16;
  uVar21 = (uVar28 ^ (uVar24 | uVar29 ^ 0xffffffff)) + iVar2 + 0x50a28be6 + uVar21;
  uVar22 = (uVar21 * 0x800 | uVar21 >> 0x15) + uVar25;
  uVar24 = uVar24 * 0x400 | uVar24 >> 0x16;
  uVar23 = (uVar18 ^ uVar26 ^ uVar19) + iVar6 + uVar23;
  uVar20 = (uVar23 * 0x20 | uVar23 >> 0x1b) + uVar27;
  uVar21 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar25 = (uVar22 ^ (uVar28 | uVar24 ^ 0xffffffff)) + iVar11 + 0x50a28be6 + uVar25;
  uVar26 = (uVar25 * 0x2000 | uVar25 >> 0x13) + uVar29;
  uVar23 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar27 = (uVar20 ^ uVar18 ^ uVar21) + iVar7 + uVar27;
  uVar28 = (uVar27 * 0x100 | uVar27 >> 0x18) + uVar19;
  uVar25 = uVar18 * 0x400 | uVar18 >> 0x16;
  uVar29 = (uVar26 ^ (uVar22 | uVar23 ^ 0xffffffff)) + iVar4 + 0x50a28be6 + uVar29;
  uVar18 = (uVar29 * 0x8000 | uVar29 >> 0x11) + uVar24;
  uVar27 = uVar22 * 0x400 | uVar22 >> 0x16;
  uVar19 = (uVar28 ^ uVar20 ^ uVar25) + iVar8 + uVar19;
  uVar22 = (uVar19 * 0x80 | uVar19 >> 0x19) + uVar21;
  uVar19 = uVar20 * 0x400 | uVar20 >> 0x16;
  uVar24 = (uVar18 ^ (uVar26 | uVar27 ^ 0xffffffff)) + iVar13 + 0x50a28be6 + uVar24;
  uVar20 = (uVar24 * 0x8000 | uVar24 >> 0x11) + uVar23;
  uVar24 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar21 = (uVar22 ^ uVar28 ^ uVar19) + iVar9 + uVar21;
  uVar26 = (uVar21 * 0x200 | uVar21 >> 0x17) + uVar25;
  uVar21 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar23 = (uVar20 ^ (uVar18 | uVar24 ^ 0xffffffff)) + iVar6 + 0x50a28be6 + uVar23;
  uVar28 = (uVar23 * 0x20 | uVar23 >> 0x1b) + uVar27;
  uVar23 = uVar18 * 0x400 | uVar18 >> 0x16;
  uVar25 = (uVar26 ^ uVar22 ^ uVar21) + iVar10 + uVar25;
  uVar18 = (uVar25 * 0x800 | uVar25 >> 0x15) + uVar19;
  uVar25 = uVar22 * 0x400 | uVar22 >> 0x16;
  uVar27 = (uVar28 ^ (uVar20 | uVar23 ^ 0xffffffff)) + iVar15 + 0x50a28be6 + uVar27;
  uVar22 = (uVar27 * 0x80 | uVar27 >> 0x19) + uVar24;
  uVar27 = uVar20 * 0x400 | uVar20 >> 0x16;
  uVar19 = (uVar18 ^ uVar26 ^ uVar25) + iVar11 + uVar19;
  uVar20 = (uVar19 * 0x2000 | uVar19 >> 0x13) + uVar21;
  uVar19 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar24 = (uVar22 ^ (uVar28 | uVar27 ^ 0xffffffff)) + iVar8 + 0x50a28be6 + uVar24;
  uVar26 = (uVar24 * 0x80 | uVar24 >> 0x19) + uVar23;
  uVar24 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar21 = (uVar20 ^ uVar18 ^ uVar19) + iVar12 + uVar21;
  uVar28 = (uVar21 * 0x4000 | uVar21 >> 0x12) + uVar25;
  uVar21 = uVar18 * 0x400 | uVar18 >> 0x16;
  uVar23 = (uVar26 ^ (uVar22 | uVar24 ^ 0xffffffff)) + iVar17 + 0x50a28be6 + uVar23;
  uVar18 = (uVar23 * 0x100 | uVar23 >> 0x18) + uVar27;
  uVar23 = uVar22 * 0x400 | uVar22 >> 0x16;
  uVar25 = (uVar28 ^ uVar20 ^ uVar21) + iVar13 + uVar25;
  uVar22 = (uVar25 * 0x8000 | uVar25 >> 0x11) + uVar19;
  uVar25 = uVar20 * 0x400 | uVar20 >> 0x16;
  uVar27 = (uVar18 ^ (uVar26 | uVar23 ^ 0xffffffff)) + iVar10 + 0x50a28be6 + uVar27;
  uVar20 = (uVar27 * 0x800 | uVar27 >> 0x15) + uVar24;
  uVar27 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar19 = (uVar22 ^ uVar28 ^ uVar25) + iVar14 + uVar19;
  uVar26 = (uVar19 * 0x40 | uVar19 >> 0x1a) + uVar21;
  uVar19 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar24 = (uVar20 ^ (uVar18 | uVar27 ^ 0xffffffff)) + iVar3 + 0x50a28be6 + uVar24;
  uVar28 = (uVar24 * 0x4000 | uVar24 >> 0x12) + uVar23;
  uVar24 = uVar18 * 0x400 | uVar18 >> 0x16;
  uVar21 = (uVar26 ^ uVar22 ^ uVar19) + iVar15 + uVar21;
  uVar18 = (uVar21 * 0x80 | uVar21 >> 0x19) + uVar25;
  uVar21 = uVar22 * 0x400 | uVar22 >> 0x16;
  uVar23 = (uVar28 ^ (uVar20 | uVar24 ^ 0xffffffff)) + iVar12 + 0x50a28be6 + uVar23;
  uVar22 = (uVar23 * 0x4000 | uVar23 >> 0x12) + uVar27;
  uVar23 = uVar20 * 0x400 | uVar20 >> 0x16;
  uVar25 = (uVar18 ^ uVar26 ^ uVar21) + iVar16 + uVar25;
  uVar20 = (uVar25 * 0x200 | uVar25 >> 0x17) + uVar19;
  uVar25 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar27 = (uVar22 ^ (uVar28 | uVar23 ^ 0xffffffff)) + iVar5 + 0x50a28be6 + uVar27;
  uVar26 = (uVar27 * 0x1000 | uVar27 >> 0x14) + uVar24;
  uVar27 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar19 = (uVar20 ^ uVar18 ^ uVar25) + iVar17 + uVar19;
  uVar28 = (uVar19 * 0x100 | uVar19 >> 0x18) + uVar21;
  uVar19 = uVar18 * 0x400 | uVar18 >> 0x16;
  uVar24 = (uVar26 ^ (uVar22 | uVar27 ^ 0xffffffff)) + iVar14 + 0x50a28be6 + uVar24;
  uVar18 = (uVar24 * 0x40 | uVar24 >> 0x1a) + uVar23;
  uVar24 = uVar22 * 0x400 | uVar22 >> 0x16;
  uVar21 = (uVar28 & uVar20 | (uVar28 ^ 0xffffffff) & uVar19) + iVar9 + 0x5a827999 + uVar21;
  uVar22 = (uVar21 * 0x80 | uVar21 >> 0x19) + uVar25;
  uVar21 = uVar20 * 0x400 | uVar20 >> 0x16;
  uVar23 = (uVar18 & uVar24 | uVar26 & (uVar24 ^ 0xffffffff)) + iVar8 + 0x5c4dd124 + uVar23;
  uVar20 = (uVar23 * 0x200 | uVar23 >> 0x17) + uVar27;
  uVar23 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar25 = (uVar22 & uVar28 | (uVar22 ^ 0xffffffff) & uVar21) + iVar6 + 0x5a827999 + uVar25;
  uVar26 = (uVar25 * 0x40 | uVar25 >> 0x1a) + uVar19;
  uVar25 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar27 = (uVar20 & uVar23 | uVar18 & (uVar23 ^ 0xffffffff)) + iVar13 + 0x5c4dd124 + uVar27;
  uVar28 = (uVar27 * 0x2000 | uVar27 >> 0x13) + uVar24;
  uVar27 = uVar18 * 0x400 | uVar18 >> 0x16;
  uVar19 = (uVar26 & uVar22 | (uVar26 ^ 0xffffffff) & uVar25) + iVar15 + 0x5a827999 + uVar19;
  uVar18 = (uVar19 * 0x100 | uVar19 >> 0x18) + uVar21;
  uVar19 = uVar22 * 0x400 | uVar22 >> 0x16;
  uVar24 = (uVar28 & uVar27 | uVar20 & (uVar27 ^ 0xffffffff)) + iVar5 + 0x5c4dd124 + uVar24;
  uVar22 = (uVar24 * 0x8000 | uVar24 >> 0x11) + uVar23;
  uVar24 = uVar20 * 0x400 | uVar20 >> 0x16;
  uVar21 = (uVar18 & uVar26 | (uVar18 ^ 0xffffffff) & uVar19) + iVar3 + 0x5a827999 + uVar21;
  uVar20 = (uVar21 * 0x2000 | uVar21 >> 0x13) + uVar25;
  uVar21 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar23 = (uVar22 & uVar24 | uVar28 & (uVar24 ^ 0xffffffff)) + iVar9 + 0x5c4dd124 + uVar23;
  uVar26 = (uVar23 * 0x80 | uVar23 >> 0x19) + uVar27;
  uVar23 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar25 = (uVar20 & uVar18 | (uVar20 ^ 0xffffffff) & uVar21) + iVar12 + 0x5a827999 + uVar25;
  uVar28 = (uVar25 * 0x800 | uVar25 >> 0x15) + uVar19;
  uVar25 = uVar18 * 0x400 | uVar18 >> 0x16;
  uVar27 = (uVar26 & uVar23 | uVar22 & (uVar23 ^ 0xffffffff)) + iVar2 + 0x5c4dd124 + uVar27;
  uVar18 = (uVar27 * 0x1000 | uVar27 >> 0x14) + uVar24;
  uVar27 = uVar22 * 0x400 | uVar22 >> 0x16;
  uVar19 = (uVar28 & uVar20 | (uVar28 ^ 0xffffffff) & uVar25) + iVar8 + 0x5a827999 + uVar19;
  uVar22 = (uVar19 * 0x200 | uVar19 >> 0x17) + uVar21;
  uVar19 = uVar20 * 0x400 | uVar20 >> 0x16;
  uVar24 = (uVar18 & uVar27 | uVar26 & (uVar27 ^ 0xffffffff)) + iVar15 + 0x5c4dd124 + uVar24;
  uVar20 = (uVar24 * 0x100 | uVar24 >> 0x18) + uVar23;
  uVar24 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar21 = (uVar22 & uVar28 | (uVar22 ^ 0xffffffff) & uVar19) + iVar17 + 0x5a827999 + uVar21;
  uVar26 = (uVar21 * 0x80 | uVar21 >> 0x19) + uVar25;
  uVar21 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar23 = (uVar20 & uVar24 | uVar18 & (uVar24 ^ 0xffffffff)) + iVar7 + 0x5c4dd124 + uVar23;
  uVar28 = (uVar23 * 0x200 | uVar23 >> 0x17) + uVar27;
  uVar23 = uVar18 * 0x400 | uVar18 >> 0x16;
  uVar25 = (uVar26 & uVar22 | (uVar26 ^ 0xffffffff) & uVar21) + iVar5 + 0x5a827999 + uVar25;
  uVar18 = (uVar25 * 0x8000 | uVar25 >> 0x11) + uVar19;
  uVar25 = uVar22 * 0x400 | uVar22 >> 0x16;
  uVar27 = (uVar28 & uVar23 | uVar20 & (uVar23 ^ 0xffffffff)) + iVar12 + 0x5c4dd124 + uVar27;
  uVar22 = (uVar27 * 0x800 | uVar27 >> 0x15) + uVar24;
  uVar27 = uVar20 * 0x400 | uVar20 >> 0x16;
  uVar19 = (uVar18 & uVar26 | (uVar18 ^ 0xffffffff) & uVar25) + iVar14 + 0x5a827999 + uVar19;
  uVar20 = (uVar19 * 0x80 | uVar19 >> 0x19) + uVar21;
  uVar19 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar24 = (uVar22 & uVar27 | uVar28 & (uVar27 ^ 0xffffffff)) + iVar16 + 0x5c4dd124 + uVar24;
  uVar26 = (uVar24 * 0x80 | uVar24 >> 0x19) + uVar23;
  uVar24 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar21 = (uVar20 & uVar18 | (uVar20 ^ 0xffffffff) & uVar19) + iVar2 + 0x5a827999 + uVar21;
  uVar28 = (uVar21 * 0x1000 | uVar21 >> 0x14) + uVar25;
  uVar21 = uVar18 * 0x400 | uVar18 >> 0x16;
  uVar23 = (uVar26 & uVar24 | uVar22 & (uVar24 ^ 0xffffffff)) + iVar17 + 0x5c4dd124 + uVar23;
  uVar18 = (uVar23 * 0x80 | uVar23 >> 0x19) + uVar27;
  uVar23 = uVar22 * 0x400 | uVar22 >> 0x16;
  uVar25 = (uVar28 & uVar20 | (uVar28 ^ 0xffffffff) & uVar21) + iVar11 + 0x5a827999 + uVar25;
  uVar22 = (uVar25 * 0x8000 | uVar25 >> 0x11) + uVar19;
  uVar25 = uVar20 * 0x400 | uVar20 >> 0x16;
  uVar27 = (uVar18 & uVar23 | uVar26 & (uVar23 ^ 0xffffffff)) + iVar10 + 0x5c4dd124 + uVar27;
  uVar20 = (uVar27 * 0x1000 | uVar27 >> 0x14) + uVar24;
  uVar27 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar19 = (uVar22 & uVar28 | (uVar22 ^ 0xffffffff) & uVar25) + iVar7 + 0x5a827999 + uVar19;
  uVar26 = (uVar19 * 0x200 | uVar19 >> 0x17) + uVar21;
  uVar19 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar24 = (uVar20 & uVar27 | uVar18 & (uVar27 ^ 0xffffffff)) + iVar14 + 0x5c4dd124 + uVar24;
  uVar28 = (uVar24 * 0x80 | uVar24 >> 0x19) + uVar23;
  uVar24 = uVar18 * 0x400 | uVar18 >> 0x16;
  uVar21 = (uVar26 & uVar22 | (uVar26 ^ 0xffffffff) & uVar19) + iVar4 + 0x5a827999 + uVar21;
  uVar18 = (uVar21 * 0x800 | uVar21 >> 0x15) + uVar25;
  uVar21 = uVar22 * 0x400 | uVar22 >> 0x16;
  uVar23 = (uVar28 & uVar24 | uVar20 & (uVar24 ^ 0xffffffff)) + iVar6 + 0x5c4dd124 + uVar23;
  uVar22 = (uVar23 * 0x40 | uVar23 >> 0x1a) + uVar27;
  uVar23 = uVar20 * 0x400 | uVar20 >> 0x16;
  uVar25 = (uVar18 & uVar26 | (uVar18 ^ 0xffffffff) & uVar21) + iVar16 + 0x5a827999 + uVar25;
  uVar20 = (uVar25 * 0x80 | uVar25 >> 0x19) + uVar19;
  uVar25 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar27 = (uVar22 & uVar23 | uVar28 & (uVar23 ^ 0xffffffff)) + iVar11 + 0x5c4dd124 + uVar27;
  uVar26 = (uVar27 * 0x8000 | uVar27 >> 0x11) + uVar24;
  uVar27 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar19 = (uVar20 & uVar18 | (uVar20 ^ 0xffffffff) & uVar25) + iVar13 + 0x5a827999 + uVar19;
  uVar28 = (uVar19 * 0x2000 | uVar19 >> 0x13) + uVar21;
  uVar19 = uVar18 * 0x400 | uVar18 >> 0x16;
  uVar24 = (uVar26 & uVar27 | uVar22 & (uVar27 ^ 0xffffffff)) + iVar3 + 0x5c4dd124 + uVar24;
  uVar18 = (uVar24 * 0x2000 | uVar24 >> 0x13) + uVar23;
  uVar24 = uVar22 * 0x400 | uVar22 >> 0x16;
  uVar21 = (uVar28 & uVar20 | (uVar28 ^ 0xffffffff) & uVar19) + iVar10 + 0x5a827999 + uVar21;
  uVar22 = (uVar21 * 0x1000 | uVar21 >> 0x14) + uVar25;
  uVar21 = uVar20 * 0x400 | uVar20 >> 0x16;
  uVar23 = (uVar18 & uVar24 | uVar26 & (uVar24 ^ 0xffffffff)) + iVar4 + 0x5c4dd124 + uVar23;
  uVar20 = (uVar23 * 0x800 | uVar23 >> 0x15) + uVar27;
  uVar23 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar25 = ((uVar22 | uVar28 ^ 0xffffffff) ^ uVar21) + iVar5 + 0x6ed9eba1 + uVar25;
  uVar26 = (uVar25 * 0x800 | uVar25 >> 0x15) + uVar19;
  uVar25 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar27 = ((uVar20 | uVar18 ^ 0xffffffff) ^ uVar23) + iVar17 + 0x6d703ef3 + uVar27;
  uVar28 = (uVar27 * 0x200 | uVar27 >> 0x17) + uVar24;
  uVar27 = uVar18 * 0x400 | uVar18 >> 0x16;
  uVar19 = ((uVar26 | uVar22 ^ 0xffffffff) ^ uVar25) + iVar12 + 0x6ed9eba1 + uVar19;
  uVar18 = (uVar19 * 0x2000 | uVar19 >> 0x13) + uVar21;
  uVar19 = uVar22 * 0x400 | uVar22 >> 0x16;
  uVar24 = ((uVar28 | uVar20 ^ 0xffffffff) ^ uVar27) + iVar7 + 0x6d703ef3 + uVar24;
  uVar22 = (uVar24 * 0x80 | uVar24 >> 0x19) + uVar23;
  uVar24 = uVar20 * 0x400 | uVar20 >> 0x16;
  uVar21 = ((uVar18 | uVar26 ^ 0xffffffff) ^ uVar19) + iVar16 + 0x6ed9eba1 + uVar21;
  uVar20 = (uVar21 * 0x40 | uVar21 >> 0x1a) + uVar25;
  uVar21 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar23 = ((uVar22 | uVar28 ^ 0xffffffff) ^ uVar24) + iVar3 + 0x6d703ef3 + uVar23;
  uVar26 = (uVar23 * 0x8000 | uVar23 >> 0x11) + uVar27;
  uVar23 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar25 = ((uVar20 | uVar18 ^ 0xffffffff) ^ uVar21) + iVar6 + 0x6ed9eba1 + uVar25;
  uVar28 = (uVar25 * 0x80 | uVar25 >> 0x19) + uVar19;
  uVar25 = uVar18 * 0x400 | uVar18 >> 0x16;
  uVar27 = ((uVar26 | uVar22 ^ 0xffffffff) ^ uVar23) + iVar5 + 0x6d703ef3 + uVar27;
  uVar18 = (uVar27 * 0x800 | uVar27 >> 0x15) + uVar24;
  uVar27 = uVar22 * 0x400 | uVar22 >> 0x16;
  uVar19 = ((uVar28 | uVar20 ^ 0xffffffff) ^ uVar25) + iVar11 + 0x6ed9eba1 + uVar19;
  uVar22 = (uVar19 * 0x4000 | uVar19 >> 0x12) + uVar21;
  uVar19 = uVar20 * 0x400 | uVar20 >> 0x16;
  uVar24 = ((uVar18 | uVar26 ^ 0xffffffff) ^ uVar27) + iVar9 + 0x6d703ef3 + uVar24;
  uVar20 = (uVar24 * 0x100 | uVar24 >> 0x18) + uVar23;
  uVar24 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar21 = ((uVar22 | uVar28 ^ 0xffffffff) ^ uVar19) + iVar17 + 0x6ed9eba1 + uVar21;
  uVar26 = (uVar21 * 0x200 | uVar21 >> 0x17) + uVar25;
  uVar21 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar23 = ((uVar20 | uVar18 ^ 0xffffffff) ^ uVar24) + iVar16 + 0x6d703ef3 + uVar23;
  uVar28 = (uVar23 * 0x40 | uVar23 >> 0x1a) + uVar27;
  uVar23 = uVar18 * 0x400 | uVar18 >> 0x16;
  uVar25 = ((uVar26 | uVar22 ^ 0xffffffff) ^ uVar21) + iVar10 + 0x6ed9eba1 + uVar25;
  uVar18 = (uVar25 * 0x2000 | uVar25 >> 0x13) + uVar19;
  uVar25 = uVar22 * 0x400 | uVar22 >> 0x16;
  uVar27 = ((uVar28 | uVar20 ^ 0xffffffff) ^ uVar23) + iVar8 + 0x6d703ef3 + uVar27;
  uVar22 = (uVar27 * 0x40 | uVar27 >> 0x1a) + uVar24;
  uVar27 = uVar20 * 0x400 | uVar20 >> 0x16;
  uVar19 = ((uVar18 | uVar26 ^ 0xffffffff) ^ uVar25) + iVar3 + 0x6ed9eba1 + uVar19;
  uVar20 = (uVar19 * 0x8000 | uVar19 >> 0x11) + uVar21;
  uVar19 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar24 = ((uVar22 | uVar28 ^ 0xffffffff) ^ uVar27) + iVar11 + 0x6d703ef3 + uVar24;
  uVar26 = (uVar24 * 0x4000 | uVar24 >> 0x12) + uVar23;
  uVar24 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar21 = ((uVar20 | uVar18 ^ 0xffffffff) ^ uVar19) + iVar4 + 0x6ed9eba1 + uVar21;
  uVar28 = (uVar21 * 0x4000 | uVar21 >> 0x12) + uVar25;
  uVar21 = uVar18 * 0x400 | uVar18 >> 0x16;
  uVar23 = ((uVar26 | uVar22 ^ 0xffffffff) ^ uVar24) + iVar13 + 0x6d703ef3 + uVar23;
  uVar18 = (uVar23 * 0x1000 | uVar23 >> 0x14) + uVar27;
  uVar23 = uVar22 * 0x400 | uVar22 >> 0x16;
  uVar25 = ((uVar28 | uVar20 ^ 0xffffffff) ^ uVar21) + iVar9 + 0x6ed9eba1 + uVar25;
  uVar22 = (uVar25 * 0x100 | uVar25 >> 0x18) + uVar19;
  uVar25 = uVar20 * 0x400 | uVar20 >> 0x16;
  uVar27 = ((uVar18 | uVar26 ^ 0xffffffff) ^ uVar23) + iVar10 + 0x6d703ef3 + uVar27;
  uVar20 = (uVar27 * 0x2000 | uVar27 >> 0x13) + uVar24;
  uVar27 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar19 = ((uVar22 | uVar28 ^ 0xffffffff) ^ uVar25) + iVar2 + 0x6ed9eba1 + uVar19;
  uVar26 = (uVar19 * 0x2000 | uVar19 >> 0x13) + uVar21;
  uVar19 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar24 = ((uVar20 | uVar18 ^ 0xffffffff) ^ uVar27) + iVar14 + 0x6d703ef3 + uVar24;
  uVar28 = (uVar24 * 0x20 | uVar24 >> 0x1b) + uVar23;
  uVar24 = uVar18 * 0x400 | uVar18 >> 0x16;
  uVar21 = ((uVar26 | uVar22 ^ 0xffffffff) ^ uVar19) + iVar8 + 0x6ed9eba1 + uVar21;
  uVar18 = (uVar21 * 0x40 | uVar21 >> 0x1a) + uVar25;
  uVar21 = uVar22 * 0x400 | uVar22 >> 0x16;
  uVar23 = ((uVar28 | uVar20 ^ 0xffffffff) ^ uVar24) + iVar4 + 0x6d703ef3 + uVar23;
  uVar22 = (uVar23 * 0x4000 | uVar23 >> 0x12) + uVar27;
  uVar23 = uVar20 * 0x400 | uVar20 >> 0x16;
  uVar25 = ((uVar18 | uVar26 ^ 0xffffffff) ^ uVar21) + iVar15 + 0x6ed9eba1 + uVar25;
  uVar20 = (uVar25 * 0x20 | uVar25 >> 0x1b) + uVar19;
  uVar25 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar27 = ((uVar22 | uVar28 ^ 0xffffffff) ^ uVar23) + iVar12 + 0x6d703ef3 + uVar27;
  uVar26 = (uVar27 * 0x2000 | uVar27 >> 0x13) + uVar24;
  uVar27 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar19 = ((uVar20 | uVar18 ^ 0xffffffff) ^ uVar25) + iVar13 + 0x6ed9eba1 + uVar19;
  uVar28 = (uVar19 * 0x1000 | uVar19 >> 0x14) + uVar21;
  uVar19 = uVar18 * 0x400 | uVar18 >> 0x16;
  uVar24 = ((uVar26 | uVar22 ^ 0xffffffff) ^ uVar27) + iVar2 + 0x6d703ef3 + uVar24;
  uVar18 = (uVar24 * 0x2000 | uVar24 >> 0x13) + uVar23;
  uVar24 = uVar22 * 0x400 | uVar22 >> 0x16;
  uVar21 = ((uVar28 | uVar20 ^ 0xffffffff) ^ uVar19) + iVar7 + 0x6ed9eba1 + uVar21;
  uVar22 = (uVar21 * 0x80 | uVar21 >> 0x19) + uVar25;
  uVar21 = uVar20 * 0x400 | uVar20 >> 0x16;
  uVar23 = ((uVar18 | uVar26 ^ 0xffffffff) ^ uVar24) + iVar6 + 0x6d703ef3 + uVar23;
  uVar20 = (uVar23 * 0x80 | uVar23 >> 0x19) + uVar27;
  uVar23 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar25 = ((uVar22 | uVar28 ^ 0xffffffff) ^ uVar21) + iVar14 + 0x6ed9eba1 + uVar25;
  uVar26 = (uVar25 * 0x20 | uVar25 >> 0x1b) + uVar19;
  uVar25 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar27 = ((uVar20 | uVar18 ^ 0xffffffff) ^ uVar23) + iVar15 + 0x6d703ef3 + uVar27;
  uVar28 = (uVar27 * 0x20 | uVar27 >> 0x1b) + uVar24;
  uVar27 = uVar18 * 0x400 | uVar18 >> 0x16;
  uVar19 = (uVar26 & uVar25 | uVar22 & (uVar25 ^ 0xffffffff)) + iVar3 + -0x70e44324 + uVar19;
  uVar18 = (uVar19 * 0x800 | uVar19 >> 0x15) + uVar21;
  uVar19 = uVar22 * 0x400 | uVar22 >> 0x16;
  uVar24 = (uVar28 & uVar20 | (uVar28 ^ 0xffffffff) & uVar27) + iVar10 + 0x7a6d76e9 + uVar24;
  uVar22 = (uVar24 * 0x8000 | uVar24 >> 0x11) + uVar23;
  uVar24 = uVar20 * 0x400 | uVar20 >> 0x16;
  uVar21 = (uVar18 & uVar19 | uVar26 & (uVar19 ^ 0xffffffff)) + iVar11 + -0x70e44324 + uVar21;
  uVar20 = (uVar21 * 0x1000 | uVar21 >> 0x14) + uVar25;
  uVar21 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar23 = (uVar22 & uVar28 | (uVar22 ^ 0xffffffff) & uVar24) + iVar8 + 0x7a6d76e9 + uVar23;
  uVar26 = (uVar23 * 0x20 | uVar23 >> 0x1b) + uVar27;
  uVar23 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar25 = (uVar20 & uVar21 | uVar18 & (uVar21 ^ 0xffffffff)) + iVar13 + -0x70e44324 + uVar25;
  uVar28 = (uVar25 * 0x4000 | uVar25 >> 0x12) + uVar19;
  uVar25 = uVar18 * 0x400 | uVar18 >> 0x16;
  uVar27 = (uVar26 & uVar22 | (uVar26 ^ 0xffffffff) & uVar23) + iVar6 + 0x7a6d76e9 + uVar27;
  uVar18 = (uVar27 * 0x100 | uVar27 >> 0x18) + uVar24;
  uVar27 = uVar22 * 0x400 | uVar22 >> 0x16;
  uVar19 = (uVar28 & uVar25 | uVar20 & (uVar25 ^ 0xffffffff)) + iVar12 + -0x70e44324 + uVar19;
  uVar22 = (uVar19 * 0x8000 | uVar19 >> 0x11) + uVar21;
  uVar19 = uVar20 * 0x400 | uVar20 >> 0x16;
  uVar24 = (uVar18 & uVar26 | (uVar18 ^ 0xffffffff) & uVar27) + iVar3 + 0x7a6d76e9 + uVar24;
  uVar20 = (uVar24 * 0x800 | uVar24 >> 0x15) + uVar23;
  uVar24 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar21 = (uVar22 & uVar19 | uVar28 & (uVar19 ^ 0xffffffff)) + iVar2 + -0x70e44324 + uVar21;
  uVar26 = (uVar21 * 0x4000 | uVar21 >> 0x12) + uVar25;
  uVar21 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar23 = (uVar20 & uVar18 | (uVar20 ^ 0xffffffff) & uVar24) + iVar5 + 0x7a6d76e9 + uVar23;
  uVar28 = (uVar23 * 0x4000 | uVar23 >> 0x12) + uVar27;
  uVar23 = uVar18 * 0x400 | uVar18 >> 0x16;
  uVar25 = (uVar26 & uVar21 | uVar22 & (uVar21 ^ 0xffffffff)) + iVar10 + -0x70e44324 + uVar25;
  uVar18 = (uVar25 * 0x8000 | uVar25 >> 0x11) + uVar19;
  uVar25 = uVar22 * 0x400 | uVar22 >> 0x16;
  uVar27 = (uVar28 & uVar20 | (uVar28 ^ 0xffffffff) & uVar23) + iVar13 + 0x7a6d76e9 + uVar27;
  uVar22 = (uVar27 * 0x4000 | uVar27 >> 0x12) + uVar24;
  uVar27 = uVar20 * 0x400 | uVar20 >> 0x16;
  uVar19 = (uVar18 & uVar25 | uVar26 & (uVar25 ^ 0xffffffff)) + iVar14 + -0x70e44324 + uVar19;
  uVar20 = (uVar19 * 0x200 | uVar19 >> 0x17) + uVar21;
  uVar19 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar24 = (uVar22 & uVar28 | (uVar22 ^ 0xffffffff) & uVar27) + iVar17 + 0x7a6d76e9 + uVar24;
  uVar26 = (uVar24 * 0x40 | uVar24 >> 0x1a) + uVar23;
  uVar24 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar21 = (uVar20 & uVar19 | uVar18 & (uVar19 ^ 0xffffffff)) + iVar6 + -0x70e44324 + uVar21;
  uVar28 = (uVar21 * 0x100 | uVar21 >> 0x18) + uVar25;
  uVar21 = uVar18 * 0x400 | uVar18 >> 0x16;
  uVar23 = (uVar26 & uVar22 | (uVar26 ^ 0xffffffff) & uVar24) + iVar2 + 0x7a6d76e9 + uVar23;
  uVar18 = (uVar23 * 0x4000 | uVar23 >> 0x12) + uVar27;
  uVar23 = uVar22 * 0x400 | uVar22 >> 0x16;
  uVar25 = (uVar28 & uVar21 | uVar20 & (uVar21 ^ 0xffffffff)) + iVar15 + -0x70e44324 + uVar25;
  uVar22 = (uVar25 * 0x200 | uVar25 >> 0x17) + uVar19;
  uVar25 = uVar20 * 0x400 | uVar20 >> 0x16;
  uVar27 = (uVar18 & uVar26 | (uVar18 ^ 0xffffffff) & uVar23) + iVar7 + 0x7a6d76e9 + uVar27;
  uVar20 = (uVar27 * 0x40 | uVar27 >> 0x1a) + uVar24;
  uVar27 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar19 = (uVar22 & uVar25 | uVar28 & (uVar25 ^ 0xffffffff)) + iVar5 + -0x70e44324 + uVar19;
  uVar26 = (uVar19 * 0x4000 | uVar19 >> 0x12) + uVar21;
  uVar19 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar24 = (uVar20 & uVar18 | (uVar20 ^ 0xffffffff) & uVar27) + iVar14 + 0x7a6d76e9 + uVar24;
  uVar28 = (uVar24 * 0x200 | uVar24 >> 0x17) + uVar23;
  uVar24 = uVar18 * 0x400 | uVar18 >> 0x16;
  uVar21 = (uVar26 & uVar19 | uVar22 & (uVar19 ^ 0xffffffff)) + iVar9 + -0x70e44324 + uVar21;
  uVar18 = (uVar21 * 0x20 | uVar21 >> 0x1b) + uVar25;
  uVar21 = uVar22 * 0x400 | uVar22 >> 0x16;
  uVar23 = (uVar28 & uVar20 | (uVar28 ^ 0xffffffff) & uVar24) + iVar4 + 0x7a6d76e9 + uVar23;
  uVar22 = (uVar23 * 0x1000 | uVar23 >> 0x14) + uVar27;
  uVar23 = uVar20 * 0x400 | uVar20 >> 0x16;
  uVar25 = (uVar18 & uVar21 | uVar26 & (uVar21 ^ 0xffffffff)) + iVar17 + -0x70e44324 + uVar25;
  uVar20 = (uVar25 * 0x40 | uVar25 >> 0x1a) + uVar19;
  uVar25 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar27 = (uVar22 & uVar28 | (uVar22 ^ 0xffffffff) & uVar23) + iVar15 + 0x7a6d76e9 + uVar27;
  uVar26 = (uVar27 * 0x200 | uVar27 >> 0x17) + uVar24;
  uVar27 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar19 = (uVar20 & uVar25 | uVar18 & (uVar25 ^ 0xffffffff)) + iVar16 + -0x70e44324 + uVar19;
  uVar28 = (uVar19 * 0x100 | uVar19 >> 0x18) + uVar21;
  uVar19 = uVar18 * 0x400 | uVar18 >> 0x16;
  uVar24 = (uVar26 & uVar22 | (uVar26 ^ 0xffffffff) & uVar27) + iVar11 + 0x7a6d76e9 + uVar24;
  uVar18 = (uVar24 * 0x1000 | uVar24 >> 0x14) + uVar23;
  uVar24 = uVar22 * 0x400 | uVar22 >> 0x16;
  uVar21 = (uVar28 & uVar19 | uVar20 & (uVar19 ^ 0xffffffff)) + iVar7 + -0x70e44324 + uVar21;
  uVar22 = (uVar21 * 0x40 | uVar21 >> 0x1a) + uVar25;
  uVar21 = uVar20 * 0x400 | uVar20 >> 0x16;
  uVar23 = (uVar18 & uVar26 | (uVar18 ^ 0xffffffff) & uVar24) + iVar9 + 0x7a6d76e9 + uVar23;
  uVar20 = (uVar23 * 0x20 | uVar23 >> 0x1b) + uVar27;
  uVar23 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar25 = (uVar22 & uVar21 | uVar28 & (uVar21 ^ 0xffffffff)) + iVar8 + -0x70e44324 + uVar25;
  uVar26 = (uVar25 * 0x20 | uVar25 >> 0x1b) + uVar19;
  uVar25 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar27 = (uVar20 & uVar18 | (uVar20 ^ 0xffffffff) & uVar23) + iVar12 + 0x7a6d76e9 + uVar27;
  uVar28 = (uVar27 * 0x8000 | uVar27 >> 0x11) + uVar24;
  uVar27 = uVar18 * 0x400 | uVar18 >> 0x16;
  uVar19 = (uVar26 & uVar25 | uVar22 & (uVar25 ^ 0xffffffff)) + iVar4 + -0x70e44324 + uVar19;
  uVar18 = (uVar19 * 0x1000 | uVar19 >> 0x14) + uVar21;
  uVar19 = uVar22 * 0x400 | uVar22 >> 0x16;
  uVar24 = (uVar28 & uVar20 | (uVar28 ^ 0xffffffff) & uVar27) + iVar16 + 0x7a6d76e9 + uVar24;
  uVar22 = (uVar24 * 0x100 | uVar24 >> 0x18) + uVar23;
  uVar24 = uVar20 * 0x400 | uVar20 >> 0x16;
  uVar21 = (uVar18 ^ (uVar26 | uVar19 ^ 0xffffffff)) + iVar6 + -0x56ac02b2 + uVar21;
  uVar20 = (uVar21 * 0x200 | uVar21 >> 0x17) + uVar25;
  uVar21 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar23 = (uVar22 ^ uVar28 ^ uVar24) + iVar14 + uVar23;
  uVar26 = (uVar23 * 0x100 | uVar23 >> 0x18) + uVar27;
  uVar23 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar25 = (uVar20 ^ (uVar18 | uVar21 ^ 0xffffffff)) + iVar2 + -0x56ac02b2 + uVar25;
  uVar28 = (uVar25 * 0x8000 | uVar25 >> 0x11) + uVar19;
  uVar25 = uVar18 * 0x400 | uVar18 >> 0x16;
  uVar27 = (uVar26 ^ uVar22 ^ uVar23) + iVar17 + uVar27;
  uVar18 = (uVar27 * 0x20 | uVar27 >> 0x1b) + uVar24;
  uVar27 = uVar22 * 0x400 | uVar22 >> 0x16;
  uVar19 = (uVar28 ^ (uVar20 | uVar25 ^ 0xffffffff)) + iVar7 + -0x56ac02b2 + uVar19;
  uVar22 = (uVar19 * 0x20 | uVar19 >> 0x1b) + uVar21;
  uVar19 = uVar20 * 0x400 | uVar20 >> 0x16;
  uVar24 = (uVar18 ^ uVar26 ^ uVar27) + iVar12 + uVar24;
  uVar20 = (uVar24 * 0x1000 | uVar24 >> 0x14) + uVar23;
  uVar24 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar21 = (uVar22 ^ (uVar28 | uVar19 ^ 0xffffffff)) + iVar11 + -0x56ac02b2 + uVar21;
  uVar26 = (uVar21 * 0x800 | uVar21 >> 0x15) + uVar25;
  uVar21 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar23 = (uVar20 ^ uVar18 ^ uVar24) + iVar6 + uVar23;
  uVar28 = (uVar23 * 0x200 | uVar23 >> 0x17) + uVar27;
  uVar23 = uVar18 * 0x400 | uVar18 >> 0x16;
  uVar25 = (uVar26 ^ (uVar22 | uVar21 ^ 0xffffffff)) + iVar9 + -0x56ac02b2 + uVar25;
  uVar18 = (uVar25 * 0x40 | uVar25 >> 0x1a) + uVar19;
  uVar25 = uVar22 * 0x400 | uVar22 >> 0x16;
  uVar27 = (uVar28 ^ uVar20 ^ uVar23) + iVar3 + uVar27;
  uVar22 = (uVar27 * 0x1000 | uVar27 >> 0x14) + uVar24;
  uVar27 = uVar20 * 0x400 | uVar20 >> 0x16;
  uVar19 = (uVar18 ^ (uVar26 | uVar25 ^ 0xffffffff)) + iVar14 + -0x56ac02b2 + uVar19;
  uVar20 = (uVar19 * 0x100 | uVar19 >> 0x18) + uVar21;
  uVar19 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar24 = (uVar22 ^ uVar28 ^ uVar27) + iVar7 + uVar24;
  uVar26 = (uVar24 * 0x20 | uVar24 >> 0x1b) + uVar23;
  uVar24 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar21 = (uVar20 ^ (uVar18 | uVar19 ^ 0xffffffff)) + iVar4 + -0x56ac02b2 + uVar21;
  uVar28 = (uVar21 * 0x2000 | uVar21 >> 0x13) + uVar25;
  uVar21 = uVar18 * 0x400 | uVar18 >> 0x16;
  uVar23 = (uVar26 ^ uVar22 ^ uVar24) + iVar10 + uVar23;
  uVar18 = (uVar23 * 0x4000 | uVar23 >> 0x12) + uVar27;
  uVar23 = uVar22 * 0x400 | uVar22 >> 0x16;
  uVar25 = (uVar28 ^ (uVar20 | uVar21 ^ 0xffffffff)) + iVar12 + -0x56ac02b2 + uVar25;
  uVar22 = (uVar25 * 0x1000 | uVar25 >> 0x14) + uVar19;
  uVar25 = uVar20 * 0x400 | uVar20 >> 0x16;
  uVar27 = (uVar18 ^ uVar26 ^ uVar23) + iVar9 + uVar27;
  uVar20 = (uVar27 * 0x40 | uVar27 >> 0x1a) + uVar24;
  uVar27 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar19 = (uVar22 ^ (uVar28 | uVar25 ^ 0xffffffff)) + iVar16 + -0x56ac02b2 + uVar19;
  uVar26 = (uVar19 * 0x20 | uVar19 >> 0x1b) + uVar21;
  uVar19 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar24 = (uVar20 ^ uVar18 ^ uVar27) + iVar8 + uVar24;
  uVar28 = (uVar24 * 0x100 | uVar24 >> 0x18) + uVar23;
  uVar24 = uVar18 * 0x400 | uVar18 >> 0x16;
  uVar21 = (uVar26 ^ (uVar22 | uVar19 ^ 0xffffffff)) + iVar3 + -0x56ac02b2 + uVar21;
  uVar18 = (uVar21 * 0x1000 | uVar21 >> 0x14) + uVar25;
  uVar21 = uVar22 * 0x400 | uVar22 >> 0x16;
  uVar23 = (uVar28 ^ uVar20 ^ uVar24) + iVar4 + uVar23;
  uVar22 = (uVar23 * 0x2000 | uVar23 >> 0x13) + uVar27;
  uVar23 = uVar20 * 0x400 | uVar20 >> 0x16;
  uVar25 = (uVar18 ^ (uVar26 | uVar21 ^ 0xffffffff)) + iVar5 + -0x56ac02b2 + uVar25;
  uVar20 = (uVar25 * 0x2000 | uVar25 >> 0x13) + uVar19;
  uVar25 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar27 = (uVar22 ^ uVar28 ^ uVar23) + iVar15 + uVar27;
  uVar26 = (uVar27 * 0x40 | uVar27 >> 0x1a) + uVar24;
  uVar27 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar19 = (uVar20 ^ (uVar18 | uVar25 ^ 0xffffffff)) + iVar10 + -0x56ac02b2 + uVar19;
  uVar28 = (uVar19 * 0x4000 | uVar19 >> 0x12) + uVar21;
  uVar19 = uVar18 * 0x400 | uVar18 >> 0x16;
  uVar24 = (uVar26 ^ uVar22 ^ uVar27) + iVar16 + uVar24;
  uVar18 = (uVar24 * 0x20 | uVar24 >> 0x1b) + uVar23;
  uVar29 = uVar22 * 0x400 | uVar22 >> 0x16;
  uVar21 = (uVar28 ^ (uVar20 | uVar19 ^ 0xffffffff)) + iVar13 + -0x56ac02b2 + uVar21;
  uVar22 = (uVar21 * 0x800 | uVar21 >> 0x15) + uVar25;
  uVar30 = uVar20 * 0x400 | uVar20 >> 0x16;
  uVar23 = (uVar18 ^ uVar26 ^ uVar29) + iVar2 + uVar23;
  uVar20 = (uVar23 * 0x8000 | uVar23 >> 0x11) + uVar27;
  uVar23 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar25 = (uVar22 ^ (uVar28 | uVar30 ^ 0xffffffff)) + iVar8 + -0x56ac02b2 + uVar25;
  uVar26 = (uVar25 * 0x100 | uVar25 >> 0x18) + uVar19;
  uVar28 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar27 = (uVar20 ^ uVar18 ^ uVar23) + iVar5 + uVar27;
  uVar24 = (uVar27 * 0x2000 | uVar27 >> 0x13) + uVar29;
  uVar18 = uVar18 * 0x400 | uVar18 >> 0x16;
  uVar19 = (uVar26 ^ (uVar22 | uVar28 ^ 0xffffffff)) + iVar17 + -0x56ac02b2 + uVar19;
  uVar19 = (uVar19 * 0x20 | uVar19 >> 0x1b) + uVar30;
  uVar22 = uVar22 * 0x400 | uVar22 >> 0x16;
  uVar29 = (uVar24 ^ uVar20 ^ uVar18) + iVar11 + uVar29;
  uVar21 = (uVar29 * 0x800 | uVar29 >> 0x15) + uVar23;
  uVar20 = uVar20 * 0x400 | uVar20 >> 0x16;
  uVar30 = (uVar19 ^ (uVar26 | uVar22 ^ 0xffffffff)) + iVar15 + -0x56ac02b2 + uVar30;
  uVar23 = (uVar21 ^ uVar24 ^ uVar20) + iVar13 + uVar23;
  uVar1 = ctx->state[1];
  ctx->state[1] = ctx->state[2] + (uVar26 * 0x400 | uVar26 >> 0x16) + uVar20;
  ctx->state[2] = ctx->state[3] + uVar22 + uVar18;
  ctx->state[3] = ctx->state[4] + uVar28 + (uVar23 * 0x800 | uVar23 >> 0x15) + uVar18;
  ctx->state[4] = ctx->state[0] + (uVar30 * 0x40 | uVar30 >> 0x1a) + uVar28 + uVar21;
  ctx->state[0] = uVar1 + uVar19 + (uVar24 * 0x400 | uVar24 >> 0x16);
  return 0;
}

Assistant:

int mbedtls_internal_ripemd160_process( mbedtls_ripemd160_context *ctx,
                                        const unsigned char data[64] )
{
    uint32_t A, B, C, D, E, Ap, Bp, Cp, Dp, Ep, X[16];

    GET_UINT32_LE( X[ 0], data,  0 );
    GET_UINT32_LE( X[ 1], data,  4 );
    GET_UINT32_LE( X[ 2], data,  8 );
    GET_UINT32_LE( X[ 3], data, 12 );
    GET_UINT32_LE( X[ 4], data, 16 );
    GET_UINT32_LE( X[ 5], data, 20 );
    GET_UINT32_LE( X[ 6], data, 24 );
    GET_UINT32_LE( X[ 7], data, 28 );
    GET_UINT32_LE( X[ 8], data, 32 );
    GET_UINT32_LE( X[ 9], data, 36 );
    GET_UINT32_LE( X[10], data, 40 );
    GET_UINT32_LE( X[11], data, 44 );
    GET_UINT32_LE( X[12], data, 48 );
    GET_UINT32_LE( X[13], data, 52 );
    GET_UINT32_LE( X[14], data, 56 );
    GET_UINT32_LE( X[15], data, 60 );

    A = Ap = ctx->state[0];
    B = Bp = ctx->state[1];
    C = Cp = ctx->state[2];
    D = Dp = ctx->state[3];
    E = Ep = ctx->state[4];

#define F1( x, y, z )   ( (x) ^ (y) ^ (z) )
#define F2( x, y, z )   ( ( (x) & (y) ) | ( ~(x) & (z) ) )
#define F3( x, y, z )   ( ( (x) | ~(y) ) ^ (z) )
#define F4( x, y, z )   ( ( (x) & (z) ) | ( (y) & ~(z) ) )
#define F5( x, y, z )   ( (x) ^ ( (y) | ~(z) ) )

#define S( x, n ) ( ( (x) << (n) ) | ( (x) >> (32 - (n)) ) )

#define P( a, b, c, d, e, r, s, f, k )                \
    do                                                \
    {                                                 \
        (a) += f( (b), (c), (d) ) + X[r] + (k);       \
        (a) = S( (a), (s) ) + (e);                    \
        (c) = S( (c), 10 );                           \
    } while( 0 )

#define P2( a, b, c, d, e, r, s, rp, sp )                               \
    do                                                                  \
    {                                                                   \
        P( (a), (b), (c), (d), (e), (r), (s), F, K );                   \
        P( a ## p, b ## p, c ## p, d ## p, e ## p,                      \
           (rp), (sp), Fp, Kp );                                        \
    } while( 0 )

#define F   F1
#define K   0x00000000
#define Fp  F5
#define Kp  0x50A28BE6
    P2( A, B, C, D, E,  0, 11,  5,  8 );
    P2( E, A, B, C, D,  1, 14, 14,  9 );
    P2( D, E, A, B, C,  2, 15,  7,  9 );
    P2( C, D, E, A, B,  3, 12,  0, 11 );
    P2( B, C, D, E, A,  4,  5,  9, 13 );
    P2( A, B, C, D, E,  5,  8,  2, 15 );
    P2( E, A, B, C, D,  6,  7, 11, 15 );
    P2( D, E, A, B, C,  7,  9,  4,  5 );
    P2( C, D, E, A, B,  8, 11, 13,  7 );
    P2( B, C, D, E, A,  9, 13,  6,  7 );
    P2( A, B, C, D, E, 10, 14, 15,  8 );
    P2( E, A, B, C, D, 11, 15,  8, 11 );
    P2( D, E, A, B, C, 12,  6,  1, 14 );
    P2( C, D, E, A, B, 13,  7, 10, 14 );
    P2( B, C, D, E, A, 14,  9,  3, 12 );
    P2( A, B, C, D, E, 15,  8, 12,  6 );
#undef F
#undef K
#undef Fp
#undef Kp

#define F   F2
#define K   0x5A827999
#define Fp  F4
#define Kp  0x5C4DD124
    P2( E, A, B, C, D,  7,  7,  6,  9 );
    P2( D, E, A, B, C,  4,  6, 11, 13 );
    P2( C, D, E, A, B, 13,  8,  3, 15 );
    P2( B, C, D, E, A,  1, 13,  7,  7 );
    P2( A, B, C, D, E, 10, 11,  0, 12 );
    P2( E, A, B, C, D,  6,  9, 13,  8 );
    P2( D, E, A, B, C, 15,  7,  5,  9 );
    P2( C, D, E, A, B,  3, 15, 10, 11 );
    P2( B, C, D, E, A, 12,  7, 14,  7 );
    P2( A, B, C, D, E,  0, 12, 15,  7 );
    P2( E, A, B, C, D,  9, 15,  8, 12 );
    P2( D, E, A, B, C,  5,  9, 12,  7 );
    P2( C, D, E, A, B,  2, 11,  4,  6 );
    P2( B, C, D, E, A, 14,  7,  9, 15 );
    P2( A, B, C, D, E, 11, 13,  1, 13 );
    P2( E, A, B, C, D,  8, 12,  2, 11 );
#undef F
#undef K
#undef Fp
#undef Kp

#define F   F3
#define K   0x6ED9EBA1
#define Fp  F3
#define Kp  0x6D703EF3
    P2( D, E, A, B, C,  3, 11, 15,  9 );
    P2( C, D, E, A, B, 10, 13,  5,  7 );
    P2( B, C, D, E, A, 14,  6,  1, 15 );
    P2( A, B, C, D, E,  4,  7,  3, 11 );
    P2( E, A, B, C, D,  9, 14,  7,  8 );
    P2( D, E, A, B, C, 15,  9, 14,  6 );
    P2( C, D, E, A, B,  8, 13,  6,  6 );
    P2( B, C, D, E, A,  1, 15,  9, 14 );
    P2( A, B, C, D, E,  2, 14, 11, 12 );
    P2( E, A, B, C, D,  7,  8,  8, 13 );
    P2( D, E, A, B, C,  0, 13, 12,  5 );
    P2( C, D, E, A, B,  6,  6,  2, 14 );
    P2( B, C, D, E, A, 13,  5, 10, 13 );
    P2( A, B, C, D, E, 11, 12,  0, 13 );
    P2( E, A, B, C, D,  5,  7,  4,  7 );
    P2( D, E, A, B, C, 12,  5, 13,  5 );
#undef F
#undef K
#undef Fp
#undef Kp

#define F   F4
#define K   0x8F1BBCDC
#define Fp  F2
#define Kp  0x7A6D76E9
    P2( C, D, E, A, B,  1, 11,  8, 15 );
    P2( B, C, D, E, A,  9, 12,  6,  5 );
    P2( A, B, C, D, E, 11, 14,  4,  8 );
    P2( E, A, B, C, D, 10, 15,  1, 11 );
    P2( D, E, A, B, C,  0, 14,  3, 14 );
    P2( C, D, E, A, B,  8, 15, 11, 14 );
    P2( B, C, D, E, A, 12,  9, 15,  6 );
    P2( A, B, C, D, E,  4,  8,  0, 14 );
    P2( E, A, B, C, D, 13,  9,  5,  6 );
    P2( D, E, A, B, C,  3, 14, 12,  9 );
    P2( C, D, E, A, B,  7,  5,  2, 12 );
    P2( B, C, D, E, A, 15,  6, 13,  9 );
    P2( A, B, C, D, E, 14,  8,  9, 12 );
    P2( E, A, B, C, D,  5,  6,  7,  5 );
    P2( D, E, A, B, C,  6,  5, 10, 15 );
    P2( C, D, E, A, B,  2, 12, 14,  8 );
#undef F
#undef K
#undef Fp
#undef Kp

#define F   F5
#define K   0xA953FD4E
#define Fp  F1
#define Kp  0x00000000
    P2( B, C, D, E, A,  4,  9, 12,  8 );
    P2( A, B, C, D, E,  0, 15, 15,  5 );
    P2( E, A, B, C, D,  5,  5, 10, 12 );
    P2( D, E, A, B, C,  9, 11,  4,  9 );
    P2( C, D, E, A, B,  7,  6,  1, 12 );
    P2( B, C, D, E, A, 12,  8,  5,  5 );
    P2( A, B, C, D, E,  2, 13,  8, 14 );
    P2( E, A, B, C, D, 10, 12,  7,  6 );
    P2( D, E, A, B, C, 14,  5,  6,  8 );
    P2( C, D, E, A, B,  1, 12,  2, 13 );
    P2( B, C, D, E, A,  3, 13, 13,  6 );
    P2( A, B, C, D, E,  8, 14, 14,  5 );
    P2( E, A, B, C, D, 11, 11,  0, 15 );
    P2( D, E, A, B, C,  6,  8,  3, 13 );
    P2( C, D, E, A, B, 15,  5,  9, 11 );
    P2( B, C, D, E, A, 13,  6, 11, 11 );
#undef F
#undef K
#undef Fp
#undef Kp

    C             = ctx->state[1] + C + Dp;
    ctx->state[1] = ctx->state[2] + D + Ep;
    ctx->state[2] = ctx->state[3] + E + Ap;
    ctx->state[3] = ctx->state[4] + A + Bp;
    ctx->state[4] = ctx->state[0] + B + Cp;
    ctx->state[0] = C;

    return( 0 );
}